

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O2

void uavs3d_ipred_ang_x_6_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  pel pVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  pel pStack_89;
  undefined8 uStack_88;
  pel first_line [128];
  
  iVar15 = width + height + -1;
  iVar7 = width * 2;
  iVar6 = iVar7;
  if (iVar15 < iVar7) {
    iVar6 = iVar15;
  }
  auVar21._8_2_ = 2;
  auVar21._0_8_ = 0x2000200020002;
  auVar21._10_2_ = 2;
  auVar21._12_2_ = 2;
  auVar21._14_2_ = 2;
  auVar21._16_2_ = 2;
  auVar21._18_2_ = 2;
  auVar21._20_2_ = 2;
  auVar21._22_2_ = 2;
  auVar21._24_2_ = 2;
  auVar21._26_2_ = 2;
  auVar21._28_2_ = 2;
  auVar21._30_2_ = 2;
  for (lVar19 = 0; lVar19 < iVar6 + -8; lVar19 = lVar19 + 0x10) {
    auVar23 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src + lVar19 + 1));
    auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src + lVar19 + 2));
    auVar5 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src + lVar19 + 3));
    auVar23 = vpaddw_avx2(auVar23,auVar5);
    auVar4 = vpaddw_avx2(auVar4,auVar4);
    auVar23 = vpaddw_avx2(auVar23,auVar4);
    auVar23 = vpaddw_avx2(auVar23,auVar21);
    auVar23 = vpsrlw_avx2(auVar23,2);
    auVar20 = vpackuswb_avx(auVar23._0_16_,auVar23._16_16_);
    *(undefined1 (*) [16])(first_line + lVar19 + -8) = auVar20;
  }
  if ((int)lVar19 < iVar6) {
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)(src + lVar19 + 1);
    auVar20 = vpmovzxbw_avx(auVar20);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(src + lVar19 + 2);
    auVar2 = vpmovzxbw_avx(auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(src + lVar19 + 3);
    auVar3 = vpmovzxbw_avx(auVar3);
    auVar20 = vpaddw_avx(auVar20,auVar3);
    auVar2 = vpaddw_avx(auVar2,auVar2);
    auVar20 = vpaddw_avx(auVar20,auVar2);
    auVar22._8_2_ = 2;
    auVar22._0_8_ = 0x2000200020002;
    auVar22._10_2_ = 2;
    auVar22._12_2_ = 2;
    auVar22._14_2_ = 2;
    auVar20 = vpaddw_avx(auVar20,auVar22);
    auVar20 = vpsrlw_avx(auVar20,2);
    auVar20 = vpackuswb_avx(auVar20,auVar20);
    *(long *)(first_line + lVar19 + -8) = auVar20._0_8_;
  }
  iVar16 = iVar15;
  if (iVar7 < iVar15) {
    iVar16 = iVar7;
  }
  for (lVar19 = (long)iVar16; lVar19 < iVar15; lVar19 = lVar19 + 0x10) {
    pVar1 = (&pStack_89)[iVar6];
    first_line[lVar19 + -8] = pVar1;
    first_line[lVar19 + -7] = pVar1;
    first_line[lVar19 + -6] = pVar1;
    first_line[lVar19 + -5] = pVar1;
    first_line[lVar19 + -4] = pVar1;
    first_line[lVar19 + -3] = pVar1;
    first_line[lVar19 + -2] = pVar1;
    first_line[lVar19 + -1] = pVar1;
    first_line[lVar19] = pVar1;
    first_line[lVar19 + 1] = pVar1;
    first_line[lVar19 + 2] = pVar1;
    first_line[lVar19 + 3] = pVar1;
    first_line[lVar19 + 4] = pVar1;
    first_line[lVar19 + 5] = pVar1;
    first_line[lVar19 + 6] = pVar1;
    first_line[lVar19 + 7] = pVar1;
  }
  if (width == 4) {
    uVar17 = 0;
    uVar18 = (ulong)(uint)height;
    if (height < 1) {
      uVar18 = 0;
    }
    for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
      *(undefined4 *)dst = *(undefined4 *)(first_line + (uVar17 - 8));
      dst = dst + i_dst;
    }
  }
  else if (width == 8) {
    uVar17 = 0;
    uVar18 = (ulong)(uint)height;
    if (height < 1) {
      uVar18 = 0;
    }
    for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
      *(undefined8 *)dst = *(undefined8 *)(first_line + (uVar17 - 8));
      dst = dst + i_dst;
    }
  }
  else if (width == 0x10) {
    uVar17 = 0;
    uVar18 = (ulong)(uint)height;
    if (height < 1) {
      uVar18 = 0;
    }
    for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
      uVar8 = *(undefined8 *)(first_line + uVar17);
      *(undefined8 *)dst = *(undefined8 *)(first_line + (uVar17 - 8));
      *(undefined8 *)(dst + 8) = uVar8;
      dst = dst + i_dst;
    }
  }
  else if (width == 0x20) {
    uVar17 = 0;
    uVar18 = (ulong)(uint)height;
    if (height < 1) {
      uVar18 = 0;
    }
    for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
      uVar8 = *(undefined8 *)(first_line + uVar17);
      uVar9 = *(undefined8 *)(first_line + uVar17 + 8);
      uVar10 = *(undefined8 *)(first_line + uVar17 + 0x10);
      *(undefined8 *)dst = *(undefined8 *)(first_line + (uVar17 - 8));
      *(undefined8 *)(dst + 8) = uVar8;
      *(undefined8 *)(dst + 0x10) = uVar9;
      *(undefined8 *)(dst + 0x18) = uVar10;
      dst = dst + i_dst;
    }
  }
  else if (width == 0x40) {
    uVar17 = 0;
    uVar18 = (ulong)(uint)height;
    if (height < 1) {
      uVar18 = 0;
    }
    for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
      uVar8 = *(undefined8 *)(first_line + (uVar17 - 8));
      uVar9 = *(undefined8 *)(first_line + uVar17);
      uVar10 = *(undefined8 *)(first_line + uVar17 + 8);
      uVar11 = *(undefined8 *)(first_line + uVar17 + 0x10);
      uVar12 = *(undefined8 *)(first_line + uVar17 + 0x20);
      uVar13 = *(undefined8 *)(first_line + uVar17 + 0x28);
      uVar14 = *(undefined8 *)(first_line + uVar17 + 0x30);
      *(undefined8 *)(dst + 0x20) = *(undefined8 *)(first_line + uVar17 + 0x18);
      *(undefined8 *)(dst + 0x28) = uVar12;
      *(undefined8 *)(dst + 0x30) = uVar13;
      *(undefined8 *)(dst + 0x38) = uVar14;
      *(undefined8 *)dst = uVar8;
      *(undefined8 *)(dst + 8) = uVar9;
      *(undefined8 *)(dst + 0x10) = uVar10;
      *(undefined8 *)(dst + 0x18) = uVar11;
      dst = dst + i_dst;
    }
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_x_6_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    ALIGNED_16(pel first_line[64 + 64]);
    int line_size = width + height - 1;
    int real_size = COM_MIN(line_size, width * 2);
    int i;
    __m256i zero = _mm256_setzero_si256();
    __m256i offset = _mm256_set1_epi16(2);
    src += 2;

    for (i = 0; i < real_size - 8; i += 16, src += 16) {
        __m256i S0 = _mm256_set_epi64x(0, *(s64 *)(src + 7), 0, *(s64 *)(src - 1));
        __m256i S1 = _mm256_set_epi64x(0, *(s64 *)(src + 8), 0, *(s64 *)(src));
        __m256i S2 = _mm256_set_epi64x(0, *(s64 *)(src + 9), 0, *(s64 *)(src + 1));

        __m256i L0 = _mm256_unpacklo_epi8(S0, zero);
        __m256i L1 = _mm256_unpacklo_epi8(S1, zero);
        __m256i L2 = _mm256_unpacklo_epi8(S2, zero);

        __m256i sum1 = _mm256_add_epi16(L0, L1);
        __m256i sum2 = _mm256_add_epi16(L1, L2);
        __m128i d0;

        sum1 = _mm256_add_epi16(sum1, sum2);

        sum1 = _mm256_add_epi16(sum1, offset);

        sum1 = _mm256_srli_epi16(sum1, 2);

        d0 = _mm_packus_epi16(_mm256_castsi256_si128(sum1), _mm256_extracti128_si256(sum1, 1));

        _mm_store_si128((__m128i *)&first_line[i], d0);
    }

    if (i < real_size) {
        __m128i zero = _mm_setzero_si128();
        __m128i offset = _mm_set1_epi16(2);
        __m128i S0 = _mm_loadu_si128((__m128i *)(src - 1));
        __m128i S2 = _mm_loadu_si128((__m128i *)(src + 1));
        __m128i S1 = _mm_loadu_si128((__m128i *)(src));

        __m128i L0 = _mm_unpacklo_epi8(S0, zero);
        __m128i L1 = _mm_unpacklo_epi8(S1, zero);
        __m128i L2 = _mm_unpacklo_epi8(S2, zero);

        __m128i sum1 = _mm_add_epi16(L0, L1);
        __m128i sum2 = _mm_add_epi16(L1, L2);

        sum1 = _mm_add_epi16(sum1, sum2);
        sum1 = _mm_add_epi16(sum1, offset);
        sum1 = _mm_srli_epi16(sum1, 2);

        sum1 = _mm_packus_epi16(sum1, sum1);
        _mm_storel_epi64((__m128i *)&first_line[i], sum1);
    }

    // padding
    for (i = real_size; i < line_size; i += 16) {
        __m128i pad = _mm_set1_epi8((char)first_line[real_size - 1]);
        _mm_storeu_si128((__m128i *)&first_line[i], pad);
    }

#define COPY_X6(w) { \
    for (i = 0; i < height; i++) { \
        memcpy(dst, first_line + i, w * sizeof(pel)); \
        dst += i_dst;\
    } \
}
    switch (width) {
    case 4:
        COPY_X6(4)
            break;
    case 8:
        COPY_X6(8)
            break;
    case 16:
        COPY_X6(16)
            break;
    case 32:
        COPY_X6(32)
            break;
    case 64:
        COPY_X6(64)
            break;
    }
}